

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BEREncode.cpp
# Opt level: O2

size_t recurse_longform(long integer,uint8_t *buf,int max)

{
  size_t sVar1;
  
  if (integer < 0x80) {
    return 0;
  }
  sVar1 = recurse_longform((ulong)integer >> 7,buf,max + -1);
  buf[(int)sVar1] = (byte)((ulong)integer >> 7) | 0x80;
  return (long)((int)sVar1 + 1);
}

Assistant:

static size_t recurse_longform(long integer, uint8_t* buf, int max){
    if(integer < 128){
        return 0;
    } else {
        int stuff = recurse_longform(integer / 128, buf, max - 1);
        buf[stuff] = ((integer / 128) | 0x80) & 0xFF;
        return stuff + 1;
    }
}